

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::IntegerTypeSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,IntegerTypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  IntegerTypeSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->signing).kind;
    token_00._2_1_ = (this->signing).field_0x2;
    token_00.numFlags.raw = (this->signing).numFlags.raw;
    token_00.rawLen = (this->signing).rawLen;
    token_00.info = (this->signing).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (IntegerTypeSyntax *)0xffffffffffffffd0) {
      local_60 = &(this->dimensions).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax IntegerTypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return signing;
        case 2: return &dimensions;
        default: return nullptr;
    }
}